

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O0

bool ON_IntersectLineLine
               (ON_Line *lineA,ON_Line *lineB,double *a,double *b,double tolerance,
               bool bIntersectSegments)

{
  bool bVar1;
  double dVar2;
  ON_3dPoint local_68;
  ON_3dPoint local_50;
  bool local_32;
  byte local_31;
  bool rc;
  double dStack_30;
  bool bIntersectSegments_local;
  double tolerance_local;
  double *b_local;
  double *a_local;
  ON_Line *lineB_local;
  ON_Line *lineA_local;
  
  local_31 = bIntersectSegments;
  dStack_30 = tolerance;
  tolerance_local = (double)b;
  b_local = a;
  a_local = (double *)lineB;
  lineB_local = lineA;
  bVar1 = ON_Intersect(lineA,lineB,a,b);
  local_32 = (bool)(-bVar1 & 1);
  if (local_32 != false) {
    if ((local_31 & 1) != 0) {
      if (0.0 < *b_local || *b_local == 0.0) {
        if (1.0 < *b_local) {
          *b_local = 1.0;
        }
      }
      else {
        *b_local = 0.0;
      }
      if (0.0 < *(double *)tolerance_local || *(double *)tolerance_local == 0.0) {
        if (1.0 < *(double *)tolerance_local) {
          *(undefined8 *)tolerance_local = 0x3ff0000000000000;
        }
      }
      else {
        *(undefined8 *)tolerance_local = 0;
      }
    }
    if (0.0 < dStack_30) {
      ON_Line::PointAt(&local_50,lineB_local,*b_local);
      ON_Line::PointAt(&local_68,(ON_Line *)a_local,*(double *)tolerance_local);
      dVar2 = ON_3dPoint::DistanceTo(&local_50,&local_68);
      local_32 = dVar2 <= dStack_30;
    }
  }
  return local_32;
}

Assistant:

bool ON_IntersectLineLine(
          const ON_Line& lineA, 
          const ON_Line& lineB, 
          double* a,
          double* b,
          double tolerance,
          bool bIntersectSegments
          )
{
  bool rc = ON_Intersect(lineA,lineB,a,b) ? true : false;
  if (rc)
  {
    if ( bIntersectSegments )
    {
      if ( *a < 0.0 )
        *a = 0.0;
      else if ( *a > 1.0 )
        *a = 1.0;
      if ( *b < 0.0 )
        *b = 0.0;
      else if ( *b > 1.0 )
        *b = 1.0;
    }
    if ( tolerance > 0.0 )
    {
      rc = (lineA.PointAt(*a).DistanceTo(lineB.PointAt(*b)) <= tolerance);
    }
  }
  return rc;
}